

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int match_lit(char **str,size_t *len,char *lit,size_t litlen,date_parse_string *capture)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  utf8_ptr *this;
  char *pcVar4;
  ulong in_RCX;
  char *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  long *in_R8;
  wchar_t next;
  wchar_t last;
  size_t rem;
  utf8_ptr p;
  size_t matchlen;
  size_t in_stack_00000020;
  int fold_case;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  utf8_ptr *in_stack_ffffffffffffffb0;
  utf8_ptr local_48;
  ulong local_40;
  int local_34;
  long *local_30;
  ulong local_28;
  char *local_20;
  ulong *local_18;
  long *local_10;
  
  if (in_RDX == (char *)0x0) {
    return 0;
  }
  local_34 = 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  if ((in_RCX != 0) && (*in_RDX == '^')) {
    local_34 = 0;
    local_20 = in_RDX + 1;
    local_28 = in_RCX - 1;
  }
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_34 == 0) {
    if (*in_RSI < local_28) {
      return 0;
    }
    iVar1 = memcmp(local_20,(void *)*in_RDI,local_28);
    if (iVar1 != 0) {
      return 0;
    }
    local_40 = local_28;
  }
  else {
    iVar1 = t3_compare_case_fold
                      ((char *)capture,in_stack_00000020,(char *)matchlen,(size_t)p.p_,(size_t *)rem
                      );
    if (iVar1 != 0) {
      return 0;
    }
  }
  utf8_ptr::utf8_ptr(in_stack_ffffffffffffffb0,
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  this = (utf8_ptr *)(*local_18 - local_40);
  if ((this != (utf8_ptr *)0x0) && (local_28 != 0)) {
    wVar2 = utf8_ptr::getch_before
                      (this,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    wVar3 = utf8_ptr::getch((utf8_ptr *)0x34294b);
    iVar1 = isalpha(wVar2);
    if ((iVar1 != 0) && (iVar1 = isalpha(wVar3), iVar1 != 0)) {
      return 0;
    }
    iVar1 = isdigit(wVar2);
    if ((iVar1 != 0) && (iVar1 = isdigit(wVar3), iVar1 != 0)) {
      return 0;
    }
  }
  *local_30 = *local_10;
  pcVar4 = utf8_ptr::getptr(&local_48);
  local_30[1] = (long)pcVar4 - *local_10;
  pcVar4 = utf8_ptr::getptr(&local_48);
  *local_10 = (long)pcVar4;
  *local_18 = (ulong)this;
  return 1;
}

Assistant:

static int match_lit(const char *&str, size_t &len,
                     const char *lit, size_t litlen,
                     date_parse_string &capture)
{
    /* if there's no literal, there's no match */
    if (lit == 0)
        return 0;

    /* if the template starts with "^", it means do not fold case */
    int fold_case = TRUE;
    if (litlen != 0 && *lit == '^')
        fold_case = FALSE, ++lit, --litlen;

    /* try matching the template text */
    size_t matchlen;
    if (fold_case)
    {
        /* compare the leading substring of 'str' with case folding */
        if (t3_compare_case_fold(lit, litlen, str, len, &matchlen) != 0)
            return FALSE;
    }
    else if (len >= litlen)
    {
        /* compare exactly as given with no case folding */
        if (memcmp(lit, str, litlen) != 0)
            return FALSE;
        matchlen = litlen;
    }
    else
    {
        /* it's too short to match */
        return FALSE;
    }

    /* get a pointer to the next character after the end of the match */
    utf8_ptr p((char *)str + matchlen);
    size_t rem = len - matchlen;

    /* make sure we ended on a suitable boundary */
    if (rem != 0 && litlen != 0)
    {
        /* get the last character of the matched text */
        wchar_t last = p.getch_before(1);
        wchar_t next = p.getch();

        /* if we ended on alphabetic, make sure the next is non-alpha */
        if (isalpha(last) && isalpha(next))
            return FALSE;

        /* if we ended on a number, maek sure the next is non-numeric */
        if (isdigit(last) && isdigit(next))
            return FALSE;
    }
    
    /* set the capture data */
    capture.p = str;
    capture.len = p.getptr() - str;

    /* advance the caller's string pointers past the match */
    str = p.getptr();
    len = rem;

    /* return success */
    return TRUE;
}